

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

bool mightBeRichTextImpl<QLatin1String>(QLatin1String text)

{
  long lVar1;
  byte bVar2;
  QStringView element;
  char cVar3;
  CutResult CVar4;
  int iVar5;
  long lVar6;
  wchar32 wVar7;
  char *pcVar8;
  char *pcVar9;
  qsizetype qVar10;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  bool bVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QStringView QVar21;
  QVarLengthArray<char16_t,_256LL> tag;
  char16_t local_25a;
  qsizetype local_258;
  QVLABase<char16_t> local_250;
  storage_type_conflict local_238 [256];
  long local_38;
  
  pcVar8 = text.m_data;
  lVar6 = text.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar6 != 0) {
    if (lVar6 < 1) {
      lVar12 = 0;
    }
    else {
      lVar11 = 0;
      do {
        bVar2 = pcVar8[lVar11];
        if (((4 < bVar2 - 9) && (bVar2 != 0x20)) &&
           ((lVar12 = lVar11, -1 < (char)bVar2 ||
            (((bVar2 != 0x85 && ((uint)bVar2 != L'\xa0')) &&
             (cVar3 = QChar::isSpace_helper((uint)bVar2), cVar3 == '\0')))))) break;
        lVar11 = lVar11 + 1;
        lVar12 = lVar6;
      } while (lVar6 != lVar11);
    }
    local_258 = 5;
    local_250.super_QVLABaseBase.a = lVar12;
    CVar4 = QtPrivate::QContainerImplHelper::mid(lVar6,(qsizetype *)&local_250,&local_258);
    if (CVar4 == Null) {
      qVar10 = 0;
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = pcVar8 + local_250.super_QVLABaseBase.a;
      qVar10 = local_258;
    }
    QVar15.m_data = pcVar9;
    QVar15.m_size = qVar10;
    QVar18.m_data = "<?xml";
    QVar18.m_size = 5;
    iVar5 = QtPrivate::compareStrings(QVar15,QVar18,CaseSensitive);
    if (iVar5 == 0) {
      lVar11 = lVar12;
      if (lVar12 < lVar6) {
        lVar12 = lVar12 + 2;
        do {
          if (((pcVar8[lVar12 + -2] == '?') && (lVar12 < lVar6)) &&
             (lVar11 = lVar12, pcVar8[lVar12 + -1] == '>')) break;
          lVar1 = lVar12 - lVar6;
          lVar12 = lVar12 + 1;
          lVar11 = lVar6;
        } while (lVar1 != 1);
      }
      lVar12 = lVar11;
      if (lVar11 < lVar6) {
        do {
          bVar2 = pcVar8[lVar11];
          if (((4 < bVar2 - 9) && (bVar2 != 0x20)) &&
             ((lVar12 = lVar11, -1 < (char)bVar2 ||
              (((bVar2 != 0x85 && ((uint)bVar2 != L'\xa0')) &&
               (cVar3 = QChar::isSpace_helper((uint)bVar2), cVar3 == '\0')))))) break;
          lVar11 = lVar11 + 1;
          lVar12 = lVar6;
        } while (lVar6 != lVar11);
      }
    }
    local_258 = 5;
    local_250.super_QVLABaseBase.a = lVar12;
    CVar4 = QtPrivate::QContainerImplHelper::mid(lVar6,(qsizetype *)&local_250,&local_258);
    qVar10 = 0;
    if (CVar4 == Null) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = pcVar8 + local_250.super_QVLABaseBase.a;
      qVar10 = local_258;
    }
    QVar16.m_data = pcVar9;
    QVar16.m_size = qVar10;
    QVar19.m_data = "<!doc";
    QVar19.m_size = 5;
    iVar5 = QtPrivate::compareStrings(QVar16,QVar19,CaseInsensitive);
    bVar13 = true;
    if (iVar5 == 0) goto LAB_004d61d9;
    if (lVar12 < lVar6) {
      do {
        cVar3 = pcVar8[lVar12];
        if (cVar3 == '&') {
          local_250.super_QVLABaseBase.a = lVar12 + 1;
          local_258 = 3;
          CVar4 = QtPrivate::QContainerImplHelper::mid(lVar6,(qsizetype *)&local_250,&local_258);
          lVar11 = local_258;
          if (CVar4 == Null) {
            lVar11 = 0;
          }
          if (lVar11 == 3) {
            if (CVar4 == Null) {
              pcVar9 = (char *)0x0;
            }
            else {
              pcVar9 = pcVar8 + local_250.super_QVLABaseBase.a;
            }
            QVar17.m_data = pcVar9;
            QVar17.m_size = 3;
            QVar20.m_data = "lt;";
            QVar20.m_size = 3;
            cVar3 = QtPrivate::equalStrings(QVar17,QVar20);
            if (cVar3 != '\0') goto LAB_004d61d9;
          }
        }
        else if ((cVar3 == '\n') || (cVar3 == '<')) {
          if ((lVar12 < lVar6) && (pcVar8[lVar12] == '<')) {
            local_250.super_QVLABaseBase.a = CONCAT62(local_250.super_QVLABaseBase.a._2_6_,0x3e);
            QVar21.m_data = (storage_type_conflict *)&local_250;
            QVar21.m_size = 1;
            lVar6 = QtPrivate::findString(text,lVar12,QVar21,CaseSensitive);
            if (lVar6 < 0) {
              bVar14 = true;
              bVar13 = true;
              goto LAB_004d61d3;
            }
            memset(&local_250,0xaa,0x218);
            local_250.super_QVLABaseBase.a = 0x100;
            local_250.super_QVLABaseBase.s = 0;
            local_250.super_QVLABaseBase.ptr = local_238;
            goto LAB_004d6010;
          }
          break;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar6);
    }
  }
  goto LAB_004d61d7;
LAB_004d6010:
  do {
    lVar12 = lVar12 + 1;
    if (lVar6 <= lVar12) {
      iVar5 = 10;
      break;
    }
    bVar2 = pcVar8[lVar12];
    if ((((bVar2 - 0x30 < 10) ||
         ((wVar7 = (wchar32)bVar2, (char)bVar2 < '\0' &&
          (iVar5 = QChar::category(wVar7), iVar5 == 3)))) ||
        (bVar2 - 0x41 < 0x3a && bVar2 - 0x61 < 0xfffffffa)) ||
       (((char)bVar2 < '\0' && (cVar3 = QChar::isLetter_helper(wVar7), cVar3 != '\0')))) {
      local_25a = QChar::toLower((uint)bVar2);
      if (local_250.super_QVLABaseBase.s == local_250.super_QVLABaseBase.a) {
        local_258 = CONCAT62(local_258._2_6_,local_25a);
        QVLABase<char16_t>::emplace_back_impl<char16_t>
                  (&local_250,0x100,local_238,(char16_t *)&local_258);
      }
      else {
        QVLABase<char16_t>::emplace_back_impl<char16_t_const&>
                  (&local_250,0x100,local_238,&local_25a);
      }
LAB_004d609e:
      iVar5 = 0;
      bVar13 = true;
    }
    else {
      qVar10 = local_250.super_QVLABaseBase.s;
      if (local_250.super_QVLABaseBase.s == 0) {
LAB_004d60fe:
        if ((4 < bVar2 - 9) && (wVar7 != L' ')) {
          if ((char)bVar2 < '\0') {
            if (((bVar2 != 0x85) && (bVar2 != 0xa0)) &&
               (cVar3 = QChar::isSpace_helper((uint)bVar2), cVar3 == '\0')) goto LAB_004d6124;
          }
          else if (bVar2 != 0x21 || qVar10 != 0) {
LAB_004d6124:
            iVar5 = 1;
            goto LAB_004d6151;
          }
        }
        goto LAB_004d609e;
      }
      iVar5 = 10;
      bVar13 = false;
      if ((4 < bVar2 - 9) && (bVar13 = false, bVar2 != 0x20)) {
        if ((char)bVar2 < '\0') {
          bVar13 = false;
          if ((bVar2 == 0x85) || (bVar2 == 0xa0)) goto LAB_004d60a3;
          cVar3 = QChar::isSpace_helper((uint)bVar2);
          if (cVar3 == '\0') goto LAB_004d60e7;
        }
        else {
LAB_004d60e7:
          if (((wVar7 != L'/') || (qVar10 == 0)) || ((2 - lVar6) + lVar12 != 1)) goto LAB_004d60fe;
        }
LAB_004d6151:
        bVar13 = false;
      }
    }
LAB_004d60a3:
  } while (bVar13);
  if (iVar5 == 10) {
    element.m_data = (storage_type_conflict *)local_250.super_QVLABaseBase.ptr;
    element.m_size = local_250.super_QVLABaseBase.s;
    iVar5 = QTextHtmlParser::lookupElement(element);
    bVar13 = iVar5 != -1;
    iVar5 = 1;
  }
  else {
    bVar13 = false;
  }
  if ((storage_type_conflict *)local_250.super_QVLABaseBase.ptr != local_238) {
    QtPrivate::sizedFree(local_250.super_QVLABaseBase.ptr,local_250.super_QVLABaseBase.a * 2);
  }
  bVar14 = iVar5 == 0;
LAB_004d61d3:
  if (!bVar14) goto LAB_004d61d9;
LAB_004d61d7:
  bVar13 = false;
LAB_004d61d9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar13;
}

Assistant:

static bool mightBeRichTextImpl(T text)
{
    if (text.isEmpty())
        return false;
    qsizetype start = 0;

    while (start < text.size() && QChar(text.at(start)).isSpace())
        ++start;

    // skip a leading <?xml ... ?> as for example with xhtml
    if (text.mid(start, 5).compare("<?xml"_L1) == 0) {
        while (start < text.size()) {
            if (text.at(start) == u'?'
                && start + 2 < text.size()
                && text.at(start + 1) == u'>') {
                start += 2;
                break;
            }
            ++start;
        }

        while (start < text.size() && QChar(text.at(start)).isSpace())
            ++start;
    }

    if (text.mid(start, 5).compare("<!doc"_L1, Qt::CaseInsensitive) == 0)
        return true;
    qsizetype open = start;
    while (open < text.size() && text.at(open) != u'<'
            && text.at(open) != u'\n') {
        if (text.at(open) == u'&' && text.mid(open + 1, 3) == "lt;"_L1)
            return true; // support desperate attempt of user to see <...>
        ++open;
    }
    if (open < text.size() && text.at(open) == u'<') {
        const qsizetype close = text.indexOf(u'>', open);
        if (close > -1) {
            QVarLengthArray<char16_t> tag;
            for (qsizetype i = open + 1; i < close; ++i) {
                const auto current = QChar(text[i]);
                if (current.isDigit() || current.isLetter())
                    tag.append(current.toLower().unicode());
                else if (!tag.isEmpty() && current.isSpace())
                    break;
                else if (!tag.isEmpty() && current == u'/' && i + 1 == close)
                    break;
                else if (!current.isSpace() && (!tag.isEmpty() || current != u'!'))
                    return false; // that's not a tag
            }
#ifndef QT_NO_TEXTHTMLPARSER
            return QTextHtmlParser::lookupElement(tag) != -1;
#else
            return false;
#endif // QT_NO_TEXTHTMLPARSER
        }
    }
    return false;
}